

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RunProgramm.cpp
# Opt level: O1

void __thiscall RunProgramm::RunProgramm(RunProgramm *this,string *file)

{
  (this->file_name)._M_dataplus._M_p = (pointer)&(this->file_name).field_2;
  (this->file_name)._M_string_length = 0;
  (this->file_name).field_2._M_local_buf[0] = '\0';
  this->lexer = (Lexer *)0x0;
  this->parser = (Interpreter *)0x0;
  std::__cxx11::string::_M_assign((string *)this);
  return;
}

Assistant:

RunProgramm::RunProgramm(string file) {
  this->file_name = file;
}